

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O2

int testJSONHelpers(int param_1,char **param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  pointer ppVar4;
  bool bVar5;
  __optional_eq_t<std::__cxx11::basic_string<char>,_char[6]> _Var6;
  ostream *poVar7;
  ValueHolder VVar8;
  Value *pVVar9;
  pointer pMVar10;
  int iVar11;
  ObjectStruct *name;
  int iVar12;
  Object<(anonymous_namespace)::ObjectStruct> *this;
  undefined1 required;
  undefined8 in_R8;
  pointer ppVar13;
  long lVar14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_04;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_05;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_06;
  Object<(anonymous_namespace)::ObjectStruct> helper;
  int i;
  undefined4 uStack_454;
  char *pcStack_450;
  undefined1 local_448 [16];
  _Any_data local_438;
  _Manager_type local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  Value v;
  Value v_4;
  cmJSONState state;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e8;
  ObjectStruct s5;
  ObjectStruct s1;
  ObjectStruct s2;
  ObjectStruct s3;
  ObjectStruct s6;
  ObjectStruct s7;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  local_140;
  _Any_data local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  ObjectStruct s4;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  local_b0;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  local_90;
  function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> local_70;
  ObjectErrorGenerator local_50;
  
  Json::Value::Value(&v,2);
  paVar1 = &state.doc.field_2;
  state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  state.parseStack.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  state.parseStack.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
  super__Vector_impl_data._M_start._1_7_ = 0;
  state.parseStack.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  state.parseStack.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  state.parseStack.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  state.doc._M_string_length = 0;
  state.doc.field_2._M_local_buf[0] = '\0';
  _i = (ulong)(uint)uStack_454 << 0x20;
  state.doc._M_dataplus._M_p = (pointer)paVar1;
  bVar5 = std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::operator()
                    ((function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)
                     (anonymous_namespace)::IntHelper,&i,&v,&state);
  if (bVar5) {
    if (i != 2) {
      poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(i == 2) failed on line ");
      iVar12 = 0x56;
      goto LAB_0019ac95;
    }
    _i = _i & 0xffffffff00000000;
    Json::Value::Value((Value *)&helper,nullValue);
    Json::Value::operator=(&v,(Value *)&helper);
    Json::Value::~Value((Value *)&helper);
    bVar5 = std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::operator()
                      ((function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)
                       (anonymous_namespace)::IntHelper,&i,&v,&state);
    if (bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(!IntHelper(i, &v, &state)) failed on line ");
      iVar12 = 0x5a;
      goto LAB_0019ac95;
    }
    _i = _i & 0xffffffff00000000;
    bVar5 = std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::operator()
                      ((function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)
                       (anonymous_namespace)::IntHelper,&i,(Value *)0x0,&state);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(IntHelper(i, nullptr, &state)) failed on line ");
      iVar12 = 0x5d;
      goto LAB_0019ac95;
    }
    if (i != 1) {
      poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(i == 1) failed on line ");
      iVar12 = 0x5e;
      goto LAB_0019ac95;
    }
    cmJSONState::~cmJSONState(&state);
    Json::Value::~Value(&v);
    Json::Value::Value(&v,2);
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_start._0_1_ = 0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_start._1_7_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    state.doc._M_string_length = 0;
    state.doc.field_2._M_local_buf[0] = '\0';
    _i = _i & 0xffffffff00000000;
    state.doc._M_dataplus._M_p = (pointer)paVar1;
    bVar5 = std::function<bool_(unsigned_int_&,_const_Json::Value_*,_cmJSONState_*)>::operator()
                      ((function<bool_(unsigned_int_&,_const_Json::Value_*,_cmJSONState_*)> *)
                       (anonymous_namespace)::UIntHelper,(uint *)&i,&v,&state);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(UIntHelper(i, &v, &state)) failed on line ");
      iVar12 = 0x68;
LAB_0019ae59:
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar12);
      std::operator<<(poVar7,"\n");
      goto LAB_0019acad;
    }
    if (i != 2) {
      poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(i == 2) failed on line ");
      iVar12 = 0x69;
      goto LAB_0019ae59;
    }
    _i = _i & 0xffffffff00000000;
    Json::Value::Value((Value *)&helper,nullValue);
    Json::Value::operator=(&v,(Value *)&helper);
    Json::Value::~Value((Value *)&helper);
    bVar5 = std::function<bool_(unsigned_int_&,_const_Json::Value_*,_cmJSONState_*)>::operator()
                      ((function<bool_(unsigned_int_&,_const_Json::Value_*,_cmJSONState_*)> *)
                       (anonymous_namespace)::UIntHelper,(uint *)&i,&v,&state);
    if (bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(!UIntHelper(i, &v, &state)) failed on line ");
      iVar12 = 0x6c;
      goto LAB_0019ae59;
    }
    _i = _i & 0xffffffff00000000;
    bVar5 = std::function<bool_(unsigned_int_&,_const_Json::Value_*,_cmJSONState_*)>::operator()
                      ((function<bool_(unsigned_int_&,_const_Json::Value_*,_cmJSONState_*)> *)
                       (anonymous_namespace)::UIntHelper,(uint *)&i,(Value *)0x0,&state);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(UIntHelper(i, nullptr, &state)) failed on line ");
      iVar12 = 0x6f;
      goto LAB_0019ae59;
    }
    if (i != 1) {
      poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(i == 1) failed on line ");
      iVar12 = 0x70;
      goto LAB_0019ae59;
    }
    cmJSONState::~cmJSONState(&state);
    Json::Value::~Value(&v);
    Json::Value::Value(&v,true);
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_start._0_1_ = 0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_start._1_7_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    state.doc._M_string_length = 0;
    state.doc.field_2._M_local_buf[0] = '\0';
    _i = _i & 0xffffffffffffff00;
    state.doc._M_dataplus._M_p = (pointer)paVar1;
    bVar5 = std::function<bool_(bool_&,_const_Json::Value_*,_cmJSONState_*)>::operator()
                      ((function<bool_(bool_&,_const_Json::Value_*,_cmJSONState_*)> *)
                       (anonymous_namespace)::BoolHelper,(bool *)&i,&v,&state);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(BoolHelper(b, &v, &state)) failed on line ");
      iVar12 = 0x7a;
LAB_0019b01c:
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar12);
      std::operator<<(poVar7,"\n");
      goto LAB_0019acad;
    }
    if ((char)i == '\0') {
      poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(b) failed on line ");
      iVar12 = 0x7b;
      goto LAB_0019b01c;
    }
    _i = _i & 0xffffffffffffff00;
    Json::Value::Value((Value *)&helper,false);
    Json::Value::operator=(&v,(Value *)&helper);
    Json::Value::~Value((Value *)&helper);
    bVar5 = std::function<bool_(bool_&,_const_Json::Value_*,_cmJSONState_*)>::operator()
                      ((function<bool_(bool_&,_const_Json::Value_*,_cmJSONState_*)> *)
                       (anonymous_namespace)::BoolHelper,(bool *)&i,&v,&state);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(BoolHelper(b, &v, &state)) failed on line ");
      iVar12 = 0x7f;
      goto LAB_0019b01c;
    }
    if ((char)i == '\x01') {
      poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(!b) failed on line ");
      iVar12 = 0x80;
      goto LAB_0019b01c;
    }
    _i = _i & 0xffffffffffffff00;
    Json::Value::Value((Value *)&helper,4);
    Json::Value::operator=(&v,(Value *)&helper);
    Json::Value::~Value((Value *)&helper);
    bVar5 = std::function<bool_(bool_&,_const_Json::Value_*,_cmJSONState_*)>::operator()
                      ((function<bool_(bool_&,_const_Json::Value_*,_cmJSONState_*)> *)
                       (anonymous_namespace)::BoolHelper,(bool *)&i,&v,&state);
    if (bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(!BoolHelper(b, &v, &state)) failed on line ");
      iVar12 = 0x84;
      goto LAB_0019b01c;
    }
    i._0_1_ = 1;
    bVar5 = std::function<bool_(bool_&,_const_Json::Value_*,_cmJSONState_*)>::operator()
                      ((function<bool_(bool_&,_const_Json::Value_*,_cmJSONState_*)> *)
                       (anonymous_namespace)::BoolHelper,(bool *)&i,(Value *)0x0,&state);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(BoolHelper(b, nullptr, &state)) failed on line ");
      iVar12 = 0x87;
      goto LAB_0019b01c;
    }
    if ((char)i == '\x01') {
      poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(!b) failed on line ");
      iVar12 = 0x88;
      goto LAB_0019b01c;
    }
    cmJSONState::~cmJSONState(&state);
    Json::Value::~Value(&v);
    Json::Value::Value(&v,"str");
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_start._0_1_ = 0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_start._1_7_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    state.doc._M_string_length = 0;
    state.doc.field_2._M_local_buf[0] = '\0';
    state.doc._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&i,"",(allocator<char> *)&helper);
    bVar5 = std::
            function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
            ::operator()((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                          *)(anonymous_namespace)::StringHelper_abi_cxx11_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,&v,
                         &state);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(StringHelper(str, &v, &state)) failed on line ");
      iVar12 = 0x92;
LAB_0019b25b:
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar12);
      std::operator<<(poVar7,"\n");
      std::__cxx11::string::~string((string *)&i);
      goto LAB_0019acad;
    }
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                            "str");
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(str == \"str\") failed on line ");
      iVar12 = 0x93;
      goto LAB_0019b25b;
    }
    std::__cxx11::string::assign((char *)&i);
    Json::Value::Value((Value *)&helper,nullValue);
    Json::Value::operator=(&v,(Value *)&helper);
    Json::Value::~Value((Value *)&helper);
    bVar5 = std::
            function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
            ::operator()((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                          *)(anonymous_namespace)::StringHelper_abi_cxx11_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,&v,
                         &state);
    if (bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(!StringHelper(str, &v, &state)) failed on line ");
      iVar12 = 0x97;
      goto LAB_0019b25b;
    }
    std::__cxx11::string::assign((char *)&i);
    bVar5 = std::
            function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
            ::operator()((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                          *)(anonymous_namespace)::StringHelper_abi_cxx11_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                         (Value *)0x0,&state);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(StringHelper(str, nullptr, &state)) failed on line ");
      iVar12 = 0x9a;
      goto LAB_0019b25b;
    }
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                            "default");
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(str == \"default\") failed on line ");
      iVar12 = 0x9b;
      goto LAB_0019b25b;
    }
    std::__cxx11::string::~string((string *)&i);
    cmJSONState::~cmJSONState(&state);
    Json::Value::~Value(&v);
    local_140.super__Function_base._M_functor._8_8_ = 0;
    local_140.super__Function_base._M_functor._M_unused._M_object = JsonErrors::INVALID_OBJECT;
    local_140._M_invoker =
         std::
         _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
         ::_M_invoke;
    local_140.super__Function_base._M_manager =
         std::
         _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
         ::_M_manager;
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Object
              ((Object<(anonymous_namespace)::ObjectStruct> *)&state,
               (ObjectErrorGenerator *)&local_140,true);
    helper.Members.
    super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x8;
    helper.Members.
    super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_8f5da;
    std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::function
              (&local_70,
               (function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)
               (anonymous_namespace)::IntHelper);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::
    Bind<(anonymous_namespace)::ObjectStruct,int,std::function<bool(int&,Json::Value_const*,cmJSONState*)>>
              ((Object<(anonymous_namespace)::ObjectStruct> *)&state,(string_view *)&helper,
               (offset_in_ObjectStruct_to_int)&local_70,
               (function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)&DAT_00000001,
               SUB81(in_R8,0));
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Object
              ((Object<(anonymous_namespace)::ObjectStruct> *)&v,
               (Object<(anonymous_namespace)::ObjectStruct> *)&state);
    std::_Function_base::~_Function_base(&local_70.super__Function_base);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::~Object
              ((Object<(anonymous_namespace)::ObjectStruct> *)&state);
    std::_Function_base::~_Function_base(&local_140.super__Function_base);
    local_50.super__Function_base._M_functor._8_8_ = 0;
    local_50.super__Function_base._M_functor._M_unused._M_object = JsonErrors::INVALID_OBJECT;
    local_50._M_invoker =
         std::
         _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
         ::_M_invoke;
    local_50.super__Function_base._M_manager =
         std::
         _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
         ::_M_manager;
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Object
              ((Object<(anonymous_namespace)::ObjectStruct> *)&state,&local_50,true);
    s1.Field1._M_dataplus._M_p = &DAT_00000006;
    s1.Field1._M_string_length = (size_type)anon_var_dwarf_8f5f3;
    std::
    function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
    ::function(&local_90,
               (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                *)(anonymous_namespace)::StringHelper_abi_cxx11_);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::
    Bind<(anonymous_namespace)::ObjectStruct,std::__cxx11::string,std::function<bool(std::__cxx11::string&,Json::Value_const*,cmJSONState*)>>
              ((Object<(anonymous_namespace)::ObjectStruct> *)&state,(string_view *)&s1,
               (offset_in_ObjectStruct_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                )&local_90,
               (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                *)&DAT_00000001,SUB81(in_R8,0));
    s2.Field1._M_dataplus._M_p = &DAT_00000006;
    s2.Field1._M_string_length = (size_type)anon_var_dwarf_8f60c;
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Object
              ((Object<(anonymous_namespace)::ObjectStruct> *)&i,
               (Object<(anonymous_namespace)::ObjectStruct> *)&v);
    v_4.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl =
         (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
            )0x0;
    v_4.start_ = 0;
    v_4.value_.int_ = 0;
    v_4.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
    v_4._12_4_ = 0;
    VVar8.string_ = (char *)operator_new(0x48);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Object
              ((Object<(anonymous_namespace)::ObjectStruct> *)VVar8.map_,
               (Object<(anonymous_namespace)::ObjectStruct> *)&i);
    v_4.start_ = (ptrdiff_t)
                 std::
                 _Function_handler<bool_((anonymous_namespace)::ObjectStruct_&,_const_Json::Value_*,_cmJSONState_*),_cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>_>
                 ::_M_invoke;
    v_4.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl =
         (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          )std::
           _Function_handler<bool_((anonymous_namespace)::ObjectStruct_&,_const_Json::Value_*,_cmJSONState_*),_cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>_>
           ::_M_manager;
    v_4.value_.string_ = VVar8.string_;
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::BindPrivate
              ((Object<(anonymous_namespace)::ObjectStruct> *)&state,(string_view *)&s2,
               (MemberFunction *)&v_4,true);
    std::_Function_base::~_Function_base((_Function_base *)&v_4);
    v_4.value_.int_ = 6;
    v_4._8_8_ = anon_var_dwarf_8f617;
    std::
    function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
    ::function(&local_b0,
               (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                *)(anonymous_namespace)::StringHelper_abi_cxx11_);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::
    Bind<std::__cxx11::string,std::function<bool(std::__cxx11::string&,Json::Value_const*,cmJSONState*)>>
              ((Object<(anonymous_namespace)::ObjectStruct> *)&state,(string_view *)&v_4,&local_b0,
               (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                *)&DAT_00000001,SUB81(in_R8,0));
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Object
              (&helper,(Object<(anonymous_namespace)::ObjectStruct> *)&state);
    std::_Function_base::~_Function_base(&local_b0.super__Function_base);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::~Object
              ((Object<(anonymous_namespace)::ObjectStruct> *)&i);
    std::_Function_base::~_Function_base(&local_90.super__Function_base);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::~Object
              ((Object<(anonymous_namespace)::ObjectStruct> *)&state);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    Json::Value::Value(&v_4,objectValue);
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_start._0_1_ = 0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_start._1_7_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    state.doc._M_string_length = 0;
    state.doc.field_2._M_local_buf[0] = '\0';
    state.doc._M_dataplus._M_p = (pointer)paVar1;
    Json::Value::Value((Value *)&s1,"Hello");
    pVVar9 = Json::Value::operator[](&v_4,"field1");
    Json::Value::operator=(pVVar9,(Value *)&s1);
    Json::Value::~Value((Value *)&s1);
    Json::Value::Value((Value *)&s1,objectValue);
    pVVar9 = Json::Value::operator[](&v_4,"field2");
    Json::Value::operator=(pVVar9,(Value *)&s1);
    Json::Value::~Value((Value *)&s1);
    Json::Value::Value((Value *)&s1,2);
    pVVar9 = Json::Value::operator[](&v_4,"field2");
    pVVar9 = Json::Value::operator[](pVVar9,"subfield");
    Json::Value::operator=(pVVar9,(Value *)&s1);
    Json::Value::~Value((Value *)&s1);
    Json::Value::Value((Value *)&s1,"world!");
    pVVar9 = Json::Value::operator[](&v_4,"field3");
    Json::Value::operator=(pVVar9,(Value *)&s1);
    Json::Value::~Value((Value *)&s1);
    Json::Value::Value((Value *)&s1,"extra");
    pVVar9 = Json::Value::operator[](&v_4,"extra");
    Json::Value::operator=(pVVar9,(Value *)&s1);
    Json::Value::~Value((Value *)&s1);
    s1.Field1._M_dataplus._M_p = (pointer)&s1.Field1.field_2;
    s1.Field1._M_string_length = 0;
    s1.Field1.field_2._M_allocated_capacity =
         s1.Field1.field_2._M_allocated_capacity & 0xffffffffffffff00;
    bVar5 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                      (&helper,&s1,&v_4,&state);
    if (bVar5) {
      bVar5 = std::operator==(&s1.Field1,"Hello");
      if (!bVar5) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(s1.Field1 == \"Hello\") failed on line ");
        iVar12 = 0xb3;
        goto LAB_0019b8c6;
      }
      if (s1.Field2 != 2) {
        poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(s1.Field2 == 2) failed on line "
                                );
        iVar12 = 0xb4;
        goto LAB_0019b8c6;
      }
      Json::Value::Value((Value *)&s2,"wrong");
      pVVar9 = Json::Value::operator[](&v_4,"field2");
      pVVar9 = Json::Value::operator[](pVVar9,"subfield");
      Json::Value::operator=(pVVar9,(Value *)&s2);
      Json::Value::~Value((Value *)&s2);
      s2.Field1._M_dataplus._M_p = (pointer)&s2.Field1.field_2;
      s2.Field1._M_string_length = 0;
      s2.Field1.field_2._M_allocated_capacity =
           s2.Field1.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bVar5 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                        (&helper,&s2,&v_4,&state);
      if (bVar5) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(!helper(s2, &v, &state)) failed on line ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xb8);
        std::operator<<(poVar7,"\n");
        bVar5 = false;
      }
      else {
        pVVar9 = Json::Value::operator[](&v_4,"field2");
        Json::Value::removeMember(pVVar9,"subfield");
        s3.Field1._M_dataplus._M_p = (pointer)&s3.Field1.field_2;
        s3.Field1._M_string_length = 0;
        s3.Field1.field_2._M_local_buf[0] = '\0';
        bVar5 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                          (&helper,&s3,&v_4,&state);
        if (bVar5) {
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(!helper(s3, &v, &state)) failed on line ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xbc);
          std::operator<<(poVar7,"\n");
          bVar5 = false;
        }
        else {
          Json::Value::removeMember(&v_4,"field2");
          s4.Field1._M_dataplus._M_p = (pointer)&s4.Field1.field_2;
          s4.Field1._M_string_length = 0;
          s4.Field1.field_2._M_local_buf[0] = '\0';
          bVar5 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                            (&helper,&s4,&v_4,&state);
          if (bVar5) {
            poVar7 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(!helper(s4, &v, &state)) failed on line ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xc0);
            std::operator<<(poVar7,"\n");
            bVar5 = false;
          }
          else {
            Json::Value::Value((Value *)&s5,objectValue);
            pVVar9 = Json::Value::operator[](&v_4,"field2");
            Json::Value::operator=(pVVar9,(Value *)&s5);
            Json::Value::~Value((Value *)&s5);
            Json::Value::Value((Value *)&s5,2);
            pVVar9 = Json::Value::operator[](&v_4,"field2");
            pVVar9 = Json::Value::operator[](pVVar9,"subfield");
            Json::Value::operator=(pVVar9,(Value *)&s5);
            Json::Value::~Value((Value *)&s5);
            Json::Value::Value((Value *)&s5,3);
            pVVar9 = Json::Value::operator[](&v_4,"field3");
            Json::Value::operator=(pVVar9,(Value *)&s5);
            Json::Value::~Value((Value *)&s5);
            s5.Field1._M_dataplus._M_p = (pointer)&s5.Field1.field_2;
            s5.Field1._M_string_length = 0;
            s5.Field1.field_2._M_local_buf[0] = '\0';
            bVar5 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                              (&helper,&s5,&v_4,&state);
            if (bVar5) {
              poVar7 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(!helper(s5, &v, &state)) failed on line ");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xc6);
              std::operator<<(poVar7,"\n");
              bVar5 = false;
            }
            else {
              Json::Value::removeMember(&v_4,"field3");
              s6.Field1._M_dataplus._M_p = (pointer)&s6.Field1.field_2;
              s6.Field1._M_string_length = 0;
              s6.Field1.field_2._M_allocated_capacity =
                   s6.Field1.field_2._M_allocated_capacity & 0xffffffffffffff00;
              bVar5 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                                (&helper,&s6,&v_4,&state);
              if (bVar5) {
                poVar7 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(!helper(s6, &v, &state)) failed on line ");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xca);
                std::operator<<(poVar7,"\n");
                bVar5 = false;
              }
              else {
                Json::Value::Value((Value *)&s7,"Hello");
                Json::Value::operator=(&v_4,(Value *)&s7);
                Json::Value::~Value((Value *)&s7);
                s7.Field1._M_dataplus._M_p = (pointer)&s7.Field1.field_2;
                s7.Field1._M_string_length = 0;
                s7.Field1.field_2._M_local_buf[0] = '\0';
                bVar5 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                                  (&helper,&s7,&v_4,&state);
                if (bVar5) {
                  poVar7 = std::operator<<((ostream *)&std::cout,
                                           "ASSERT_TRUE(!helper(s7, &v, &state)) failed on line ");
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xce);
                  std::operator<<(poVar7,"\n");
                  bVar5 = false;
                }
                else {
                  local_120._M_unused._M_object = &local_110;
                  local_120._8_8_ = 0;
                  local_110._M_local_buf[0] = '\0';
                  bVar5 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::
                          operator()(&helper,(ObjectStruct *)&local_120,(Value *)0x0,&state);
                  if (bVar5) {
                    poVar7 = std::operator<<((ostream *)&std::cout,
                                             "ASSERT_TRUE(!helper(s8, nullptr, &state)) failed on line "
                                            );
                    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xd1);
                    std::operator<<(poVar7,"\n");
                  }
                  bVar5 = !bVar5;
                  std::__cxx11::string::~string((string *)local_120._M_pod_data);
                }
                std::__cxx11::string::~string((string *)&s7);
              }
              std::__cxx11::string::~string((string *)&s6);
            }
            std::__cxx11::string::~string((string *)&s5);
          }
          std::__cxx11::string::~string((string *)&s4);
        }
        std::__cxx11::string::~string((string *)&s3);
      }
      std::__cxx11::string::~string((string *)&s2);
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(helper(s1, &v, &state)) failed on line ");
      iVar12 = 0xb2;
LAB_0019b8c6:
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar12);
      std::operator<<(poVar7,"\n");
      bVar5 = false;
    }
    std::__cxx11::string::~string((string *)&s1);
    cmJSONState::~cmJSONState(&state);
    Json::Value::~Value(&v_4);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::~Object(&helper);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::~Object
              ((Object<(anonymous_namespace)::ObjectStruct> *)&v);
    if (!bVar5) {
      return 1;
    }
    s6.Field1._M_string_length = 0;
    s6.Field1._M_dataplus._M_p = (pointer)anon_unknown.dwarf_8c269::ErrorMessages::InvalidObject;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_start._0_1_ = 0;
    state.doc._M_string_length =
         (size_type)
         std::
         _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
         ::_M_invoke;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_finish =
         (pointer)anon_unknown.dwarf_8c269::ErrorMessages::InvalidObject;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    state.doc._M_dataplus._M_p =
         (pointer)std::
                  _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                  ::_M_manager;
    s6.Field1.field_2._M_allocated_capacity = 0;
    s6.Field1.field_2._8_8_ = 0;
    state.doc.field_2._M_local_buf[0] = '\x01';
    v_4.value_.int_ = 6;
    v_4._8_8_ = anon_var_dwarf_8f5f3;
    std::
    function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
    ::function((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                *)&s7,(function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                       *)(anonymous_namespace)::StringHelper_abi_cxx11_);
    std::
    function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
    ::function((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                *)&helper,
               (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                *)&s7);
    helper.Error.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    _i = (pointer)0x0;
    pcStack_450 = (char *)0x0;
    local_448._0_8_ = 0;
    local_448._8_8_ = 0;
    _i = operator_new(0x28);
    *(undefined8 *)_i = 0;
    *(undefined8 *)(_i + 8) = 0;
    *(undefined8 *)(_i + 0x10) = 0;
    *(undefined8 *)(_i + 0x18) = helper._24_8_;
    pMVar10 = helper.Members.
              super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (helper.Members.
        super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      *(pointer *)_i =
           helper.Members.
           super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)(_i + 8) =
           helper.Members.
           super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)(_i + 0x10) =
           helper.Members.
           super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pMVar10 = (pointer)&helper.Members.
                          super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
      helper.Members.
      super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      helper.AnyRequired = false;
      helper._25_7_ = 0;
    }
    *(undefined8 *)(_i + 0x20) = 0;
    local_448._8_8_ =
         std::
         _Function_handler<bool_((anonymous_namespace)::InheritedStruct_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
         ::_M_invoke;
    local_448._0_8_ =
         std::
         _Function_handler<bool_((anonymous_namespace)::InheritedStruct_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
         ::_M_manager;
    cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::BindPrivate
              ((Object<(anonymous_namespace)::InheritedStruct> *)&state,(string_view *)&v_4,
               (MemberFunction *)&i,SUB81(pMVar10,0));
    std::_Function_base::~_Function_base((_Function_base *)&i);
    std::_Function_base::~_Function_base((_Function_base *)&helper);
    s1.Field1._M_dataplus._M_p = &DAT_00000006;
    s1.Field1._M_string_length = (size_type)anon_var_dwarf_8f60c;
    std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::function
              ((function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)&local_120,
               (function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)
               (anonymous_namespace)::IntHelper);
    std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::function
              ((function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)&helper,
               (function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)&local_120);
    helper.Error.super__Function_base._M_functor._M_unused._M_member_pointer = 0x20;
    _i = (pointer)0x0;
    pcStack_450 = (char *)0x0;
    local_448._0_8_ = 0;
    local_448._8_8_ = 0;
    _i = operator_new(0x28);
    *(undefined8 *)_i = 0;
    *(undefined8 *)(_i + 8) = 0;
    *(undefined8 *)(_i + 0x10) = 0;
    *(undefined8 *)(_i + 0x18) = helper._24_8_;
    pMVar10 = helper.Members.
              super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (helper.Members.
        super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      *(pointer *)_i =
           helper.Members.
           super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)(_i + 8) =
           helper.Members.
           super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)(_i + 0x10) =
           helper.Members.
           super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pMVar10 = (pointer)&helper.Members.
                          super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
      helper.Members.
      super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      helper.AnyRequired = false;
      helper._25_7_ = 0;
    }
    *(undefined8 *)(_i + 0x20) = 0x20;
    local_448._8_8_ =
         std::
         _Function_handler<bool_((anonymous_namespace)::InheritedStruct_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
         ::_M_invoke;
    local_448._0_8_ =
         std::
         _Function_handler<bool_((anonymous_namespace)::InheritedStruct_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
         ::_M_manager;
    cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::BindPrivate
              ((Object<(anonymous_namespace)::InheritedStruct> *)&state,(string_view *)&s1,
               (MemberFunction *)&i,SUB81(pMVar10,0));
    std::_Function_base::~_Function_base((_Function_base *)&i);
    std::_Function_base::~_Function_base((_Function_base *)&helper);
    s2.Field1._M_dataplus._M_p = &DAT_00000006;
    s2.Field1._M_string_length = (size_type)anon_var_dwarf_8f617;
    std::
    function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
    ::function(&local_140,
               (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                *)(anonymous_namespace)::StringHelper_abi_cxx11_);
    std::
    function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
    ::function((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                *)&helper,&local_140);
    helper.Error.super__Function_base._M_functor._M_unused._M_member_pointer = 0x28;
    _i = (pointer)0x0;
    pcStack_450 = (char *)0x0;
    local_448._0_8_ = 0;
    local_448._8_8_ = 0;
    _i = operator_new(0x28);
    *(undefined8 *)_i = 0;
    *(undefined8 *)(_i + 8) = 0;
    *(undefined8 *)(_i + 0x10) = 0;
    *(undefined8 *)(_i + 0x18) = helper._24_8_;
    pMVar10 = helper.Members.
              super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (helper.Members.
        super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      *(pointer *)_i =
           helper.Members.
           super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)(_i + 8) =
           helper.Members.
           super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)(_i + 0x10) =
           helper.Members.
           super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pMVar10 = (pointer)&helper.Members.
                          super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
      helper.Members.
      super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      helper.AnyRequired = false;
      helper._25_7_ = 0;
    }
    *(undefined8 *)(_i + 0x20) = 0x28;
    local_448._8_8_ =
         std::
         _Function_handler<bool_((anonymous_namespace)::InheritedStruct_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
         ::_M_invoke;
    local_448._0_8_ =
         std::
         _Function_handler<bool_((anonymous_namespace)::InheritedStruct_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
         ::_M_manager;
    name = &s2;
    cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::BindPrivate
              ((Object<(anonymous_namespace)::InheritedStruct> *)&state,(string_view *)name,
               (MemberFunction *)&i,SUB81(pMVar10,0));
    std::_Function_base::~_Function_base((_Function_base *)&i);
    std::_Function_base::~_Function_base((_Function_base *)&helper);
    lVar14 = CONCAT71(state.parseStack.
                      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                      state.parseStack.
                      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish._0_1_) -
             (long)state.parseStack.
                   super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    v.value_.int_ = 0;
    v.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
    v._12_4_ = 0;
    v.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl =
         (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
            )0x0;
    VVar8.map_ = (ObjectValues *)
                 std::
                 _Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member>_>
                 ::_M_allocate((_Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member>_>
                                *)(lVar14 / 0x38),(size_t)name);
    v.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl =
         (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          )(lVar14 + (long)VVar8.string_);
    ppVar4 = (pointer)CONCAT71(state.parseStack.
                               super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                               state.parseStack.
                               super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish._0_1_);
    v.value_.map_ = VVar8.map_;
    v._8_8_ = VVar8.map_;
    for (ppVar13 = state.parseStack.
                   super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; required = (undefined1)in_R8,
        ppVar13 != ppVar4; ppVar13 = (pointer)&ppVar13[1].first.field_2) {
      pcVar2 = (char *)(ppVar13->first)._M_string_length;
      *(pointer *)VVar8.string_ = (ppVar13->first)._M_dataplus._M_p;
      *(char **)&((VVar8.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header = pcVar2;
      ((VVar8.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      ((VVar8.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      ((VVar8.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      ((VVar8.map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      if (ppVar13->second != (Value *)0x0) {
        (*(code *)ppVar13->second)
                  (&((VVar8.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent,
                   &(ppVar13->first).field_2,2);
        pcVar3 = ppVar13[1].first._M_dataplus._M_p;
        ((VVar8.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)ppVar13->second;
        ((VVar8.map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = (size_t)pcVar3;
      }
      *(bool *)(VVar8.int_ + 0x30) = SUB81(ppVar13[1].first._M_string_length,0);
      VVar8.string_ = (char *)(VVar8.int_ + 0x38);
    }
    v.start_ = CONCAT71(v.start_._1_7_,
                        state.errors.
                        super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_1_);
    v._8_8_ = VVar8;
    std::
    function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::function((function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)&v.limit_,
               (function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)&state.errors.
                   super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
    std::_Function_base::~_Function_base(&local_140.super__Function_base);
    std::_Function_base::~_Function_base((_Function_base *)&local_120);
    std::_Function_base::~_Function_base((_Function_base *)&s7);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::~Object
              ((Object<(anonymous_namespace)::InheritedStruct> *)&state);
    std::_Function_base::~_Function_base((_Function_base *)&s6);
    Json::Value::Value((Value *)&s5,objectValue);
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_start._0_1_ = 0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_start._1_7_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    state.doc._M_string_length = 0;
    state.doc.field_2._M_local_buf[0] = '\0';
    state.doc._M_dataplus._M_p = (pointer)paVar1;
    Json::Value::Value((Value *)&helper,"Hello");
    pVVar9 = Json::Value::operator[]((Value *)&s5,"field1");
    Json::Value::operator=(pVVar9,(Value *)&helper);
    Json::Value::~Value((Value *)&helper);
    Json::Value::Value((Value *)&helper,2);
    pVVar9 = Json::Value::operator[]((Value *)&s5,"field2");
    Json::Value::operator=(pVVar9,(Value *)&helper);
    Json::Value::~Value((Value *)&helper);
    Json::Value::Value((Value *)&helper,"world!");
    pVVar9 = Json::Value::operator[]((Value *)&s5,"field3");
    Json::Value::operator=(pVVar9,(Value *)&helper);
    Json::Value::~Value((Value *)&helper);
    Json::Value::Value((Value *)&helper,"extra");
    pVVar9 = Json::Value::operator[]((Value *)&s5,"extra");
    Json::Value::operator=(pVVar9,(Value *)&helper);
    Json::Value::~Value((Value *)&helper);
    helper.Members.
    super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&helper.Members.
                   super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    helper.Members.
    super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    helper.Members.
    super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)helper.Members.
                          super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    helper.Error.super__Function_base._M_functor._8_8_ = &helper.Error._M_invoker;
    helper.Error.super__Function_base._M_manager = (_Manager_type)0x0;
    helper.Error._M_invoker._0_1_ = 0;
    bVar5 = cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::operator()
                      ((Object<(anonymous_namespace)::InheritedStruct> *)&v,
                       (InheritedStruct *)&helper,(Value *)&s5,&state);
    if (bVar5) {
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &helper,"Hello");
      if (!bVar5) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(s1.Field1 == \"Hello\") failed on line ");
        iVar12 = 0xe8;
        goto LAB_0019c183;
      }
      if (helper.Error.super__Function_base._M_functor._0_4_ != 2) {
        poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(s1.Field2 == 2) failed on line "
                                );
        iVar12 = 0xe9;
        goto LAB_0019c183;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&helper.Error.super__Function_base._M_functor + 8),"world!");
      if (!bVar5) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(s1.Field3 == \"world!\") failed on line ");
        iVar12 = 0xea;
        goto LAB_0019c183;
      }
      Json::Value::Value((Value *)&i,"wrong");
      pVVar9 = Json::Value::operator[]((Value *)&s5,"field2");
      Json::Value::operator=(pVVar9,(Value *)&i);
      Json::Value::~Value((Value *)&i);
      _i = local_448;
      pcStack_450 = (char *)0x0;
      local_448._0_8_ = local_448._0_8_ & 0xffffffffffffff00;
      local_438._8_8_ = &local_420;
      local_428 = (_Manager_type)0x0;
      local_420._M_local_buf[0] = '\0';
      bVar5 = cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::operator()
                        ((Object<(anonymous_namespace)::InheritedStruct> *)&v,(InheritedStruct *)&i,
                         (Value *)&s5,&state);
      if (bVar5) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(!helper(s2, &v, &state)) failed on line ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xee);
        std::operator<<(poVar7,"\n");
        bVar5 = false;
      }
      else {
        Json::Value::removeMember((Value *)&s5,"field2");
        v_4.value_.string_ = (char *)&v_4.comments_;
        v_4.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
        v_4._12_4_ = 0;
        v_4.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl =
             (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              )((ulong)v_4.comments_.ptr_._M_t.
                       super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                       .
                       super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                       ._M_head_impl & 0xffffffffffffff00);
        bVar5 = cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::operator()
                          ((Object<(anonymous_namespace)::InheritedStruct> *)&v,
                           (InheritedStruct *)&v_4,(Value *)&s5,&state);
        if (bVar5) {
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(!helper(s3, &v, &state)) failed on line ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xf2);
          std::operator<<(poVar7,"\n");
          bVar5 = false;
        }
        else {
          Json::Value::Value((Value *)&s1,2);
          pVVar9 = Json::Value::operator[]((Value *)&s5,"field2");
          Json::Value::operator=(pVVar9,(Value *)&s1);
          Json::Value::~Value((Value *)&s1);
          Json::Value::Value((Value *)&s1,3);
          pVVar9 = Json::Value::operator[]((Value *)&s5,"field3");
          Json::Value::operator=(pVVar9,(Value *)&s1);
          Json::Value::~Value((Value *)&s1);
          s1.Field1._M_dataplus._M_p = (pointer)&s1.Field1.field_2;
          s1.Field1._M_string_length = 0;
          s1.Field1.field_2._M_allocated_capacity =
               s1.Field1.field_2._M_allocated_capacity & 0xffffffffffffff00;
          bVar5 = cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::operator()
                            ((Object<(anonymous_namespace)::InheritedStruct> *)&v,
                             (InheritedStruct *)&s1,(Value *)&s5,&state);
          if (bVar5) {
            poVar7 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(!helper(s4, &v, &state)) failed on line ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xf7);
            std::operator<<(poVar7,"\n");
            bVar5 = false;
          }
          else {
            Json::Value::removeMember((Value *)&s5,"field3");
            s2.Field1._M_dataplus._M_p = (pointer)&s2.Field1.field_2;
            s2.Field1._M_string_length = 0;
            s2.Field1.field_2._M_allocated_capacity =
                 s2.Field1.field_2._M_allocated_capacity & 0xffffffffffffff00;
            bVar5 = cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::operator()
                              ((Object<(anonymous_namespace)::InheritedStruct> *)&v,
                               (InheritedStruct *)&s2,(Value *)&s5,&state);
            if (bVar5) {
              poVar7 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(!helper(s5, &v, &state)) failed on line ");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xfb);
              std::operator<<(poVar7,"\n");
              bVar5 = false;
            }
            else {
              Json::Value::Value((Value *)&s3,"Hello");
              Json::Value::operator=((Value *)&s5,(Value *)&s3);
              Json::Value::~Value((Value *)&s3);
              s3.Field1._M_dataplus._M_p = (pointer)&s3.Field1.field_2;
              s3.Field1._M_string_length = 0;
              s3.Field1.field_2._M_local_buf[0] = '\0';
              bVar5 = cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::
                      operator()((Object<(anonymous_namespace)::InheritedStruct> *)&v,
                                 (InheritedStruct *)&s3,(Value *)&s5,&state);
              if (bVar5) {
                poVar7 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(!helper(s6, &v, &state)) failed on line ");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xff);
                std::operator<<(poVar7,"\n");
                bVar5 = false;
              }
              else {
                s4.Field1._M_dataplus._M_p = (pointer)&s4.Field1.field_2;
                s4.Field1._M_string_length = 0;
                s4.Field1.field_2._M_local_buf[0] = '\0';
                bVar5 = cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::
                        operator()((Object<(anonymous_namespace)::InheritedStruct> *)&v,
                                   (InheritedStruct *)&s4,(Value *)0x0,&state);
                if (bVar5) {
                  poVar7 = std::operator<<((ostream *)&std::cout,
                                           "ASSERT_TRUE(!helper(s7, nullptr, &state)) failed on line "
                                          );
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x102);
                  std::operator<<(poVar7,"\n");
                }
                bVar5 = !bVar5;
                anon_unknown.dwarf_8c269::InheritedStruct::~InheritedStruct((InheritedStruct *)&s4);
              }
              anon_unknown.dwarf_8c269::InheritedStruct::~InheritedStruct((InheritedStruct *)&s3);
            }
            anon_unknown.dwarf_8c269::InheritedStruct::~InheritedStruct((InheritedStruct *)&s2);
          }
          anon_unknown.dwarf_8c269::InheritedStruct::~InheritedStruct((InheritedStruct *)&s1);
        }
        anon_unknown.dwarf_8c269::InheritedStruct::~InheritedStruct((InheritedStruct *)&v_4);
      }
      anon_unknown.dwarf_8c269::InheritedStruct::~InheritedStruct((InheritedStruct *)&i);
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(helper(s1, &v, &state)) failed on line ");
      iVar12 = 0xe7;
LAB_0019c183:
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar12);
      std::operator<<(poVar7,"\n");
      bVar5 = false;
    }
    anon_unknown.dwarf_8c269::InheritedStruct::~InheritedStruct((InheritedStruct *)&helper);
    cmJSONState::~cmJSONState(&state);
    Json::Value::~Value((Value *)&s5);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::~Object
              ((Object<(anonymous_namespace)::InheritedStruct> *)&v);
    if (!bVar5) {
      return 1;
    }
    s1.Field1._M_string_length = 0;
    s1.Field1._M_dataplus._M_p = (pointer)anon_unknown.dwarf_8c269::ErrorMessages::InvalidObject;
    s1.Field1.field_2._8_8_ =
         std::
         _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
         ::_M_invoke;
    s1.Field1.field_2._M_allocated_capacity =
         (size_type)
         std::
         _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
         ::_M_manager;
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Object
              ((Object<(anonymous_namespace)::ObjectStruct> *)&state,(ObjectErrorGenerator *)&s1,
               false);
    helper.Members.
    super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000006;
    helper.Members.
    super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_8f5f3;
    std::
    function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
    ::function((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                *)&s2,(function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                       *)(anonymous_namespace)::StringHelper_abi_cxx11_);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::
    Bind<(anonymous_namespace)::ObjectStruct,std::__cxx11::string,std::function<bool(std::__cxx11::string&,Json::Value_const*,cmJSONState*)>>
              ((Object<(anonymous_namespace)::ObjectStruct> *)&state,(string_view *)&helper,
               (offset_in_ObjectStruct_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                )&s2,(function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                      *)&DAT_00000001,(bool)required);
    _i = &DAT_00000006;
    pcStack_450 = "field2";
    std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::function
              ((function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)&s3,
               (function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)
               (anonymous_namespace)::IntHelper);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::
    Bind<(anonymous_namespace)::ObjectStruct,int,std::function<bool(int&,Json::Value_const*,cmJSONState*)>>
              ((Object<(anonymous_namespace)::ObjectStruct> *)&state,(string_view *)&i,
               (offset_in_ObjectStruct_to_int)&s3,
               (function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)&DAT_00000001,
               (bool)required);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Object
              ((Object<(anonymous_namespace)::ObjectStruct> *)&v,
               (Object<(anonymous_namespace)::ObjectStruct> *)&state);
    std::_Function_base::~_Function_base((_Function_base *)&s3);
    std::_Function_base::~_Function_base((_Function_base *)&s2);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::~Object
              ((Object<(anonymous_namespace)::ObjectStruct> *)&state);
    std::_Function_base::~_Function_base((_Function_base *)&s1);
    Json::Value::Value((Value *)&helper,objectValue);
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_start._0_1_ = 0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_start._1_7_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    state.doc._M_string_length = 0;
    state.doc.field_2._M_local_buf[0] = '\0';
    state.doc._M_dataplus._M_p = (pointer)paVar1;
    Json::Value::Value((Value *)&i,"Hello");
    pVVar9 = Json::Value::operator[]((Value *)&helper,"field1");
    Json::Value::operator=(pVVar9,(Value *)&i);
    Json::Value::~Value((Value *)&i);
    Json::Value::Value((Value *)&i,2);
    pVVar9 = Json::Value::operator[]((Value *)&helper,"field2");
    Json::Value::operator=(pVVar9,(Value *)&i);
    Json::Value::~Value((Value *)&i);
    pcStack_450 = (char *)0x0;
    local_448._0_8_ = local_448._0_8_ & 0xffffffffffffff00;
    _i = local_448;
    bVar5 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                      ((Object<(anonymous_namespace)::ObjectStruct> *)&v,(ObjectStruct *)&i,
                       (Value *)&helper,&state);
    if (bVar5) {
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &i,"Hello");
      if (!bVar5) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(s1.Field1 == \"Hello\") failed on line ");
        iVar12 = 0x115;
        goto LAB_0019c4f9;
      }
      if (local_438._0_4_ != 2) {
        poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(s1.Field2 == 2) failed on line "
                                );
        iVar12 = 0x116;
        goto LAB_0019c4f9;
      }
      Json::Value::Value(&v_4,"world!");
      pVVar9 = Json::Value::operator[]((Value *)&helper,"extra");
      Json::Value::operator=(pVVar9,&v_4);
      Json::Value::~Value(&v_4);
      v_4.value_.string_ = (char *)&v_4.comments_;
      v_4.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
      v_4._12_4_ = 0;
      v_4.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl =
           (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            )((ulong)v_4.comments_.ptr_._M_t.
                     super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                     .
                     super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                     ._M_head_impl & 0xffffffffffffff00);
      bVar5 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                        ((Object<(anonymous_namespace)::ObjectStruct> *)&v,(ObjectStruct *)&v_4,
                         (Value *)&helper,&state);
      if (bVar5) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(!helper(s2, &v, &state)) failed on line ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x11a);
        std::operator<<(poVar7,"\n");
      }
      bVar5 = !bVar5;
      std::__cxx11::string::~string((string *)&v_4);
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(helper(s1, &v, &state)) failed on line ");
      iVar12 = 0x114;
LAB_0019c4f9:
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar12);
      std::operator<<(poVar7,"\n");
      bVar5 = false;
    }
    std::__cxx11::string::~string((string *)&i);
    cmJSONState::~cmJSONState(&state);
    Json::Value::~Value((Value *)&helper);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::~Object
              ((Object<(anonymous_namespace)::ObjectStruct> *)&v);
    if (!bVar5) {
      return 1;
    }
    s2.Field1._M_string_length = 0;
    s2.Field1._M_dataplus._M_p = (pointer)anon_unknown.dwarf_8c269::ErrorMessages::InvalidObject;
    s2.Field1.field_2._8_8_ =
         std::
         _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
         ::_M_invoke;
    s2.Field1.field_2._M_allocated_capacity =
         (size_type)
         std::
         _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
         ::_M_manager;
    iVar12 = 1;
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Object
              ((Object<(anonymous_namespace)::ObjectStruct> *)&state,(ObjectErrorGenerator *)&s2,
               true);
    helper.Members.
    super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000006;
    helper.Members.
    super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_8f5f3;
    std::
    function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
    ::function((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                *)&s3,(function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                       *)(anonymous_namespace)::StringHelper_abi_cxx11_);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::
    Bind<(anonymous_namespace)::ObjectStruct,std::__cxx11::string,std::function<bool(std::__cxx11::string&,Json::Value_const*,cmJSONState*)>>
              ((Object<(anonymous_namespace)::ObjectStruct> *)&state,(string_view *)&helper,
               (offset_in_ObjectStruct_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                )&s3,(function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                      *)0x0,(bool)required);
    _i = &DAT_00000006;
    pcStack_450 = "field2";
    std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::function
              ((function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)&s4,
               (function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)
               (anonymous_namespace)::IntHelper);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::
    Bind<(anonymous_namespace)::ObjectStruct,int,std::function<bool(int&,Json::Value_const*,cmJSONState*)>>
              ((Object<(anonymous_namespace)::ObjectStruct> *)&state,(string_view *)&i,
               (offset_in_ObjectStruct_to_int)&s4,
               (function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)0x0,(bool)required);
    v_4.value_.int_ = 8;
    v_4._8_8_ = anon_var_dwarf_8f768;
    std::
    function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
    ::function((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                *)&s5,(function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                       *)(anonymous_namespace)::StringHelper_abi_cxx11_);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::
    Bind<std::__cxx11::string,std::function<bool(std::__cxx11::string&,Json::Value_const*,cmJSONState*)>>
              ((Object<(anonymous_namespace)::ObjectStruct> *)&state,(string_view *)&v_4,&s5,
               (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                *)0x0,(bool)required);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Object
              ((Object<(anonymous_namespace)::ObjectStruct> *)&v,
               (Object<(anonymous_namespace)::ObjectStruct> *)&state);
    std::_Function_base::~_Function_base((_Function_base *)&s5);
    std::_Function_base::~_Function_base((_Function_base *)&s4);
    std::_Function_base::~_Function_base((_Function_base *)&s3);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::~Object
              ((Object<(anonymous_namespace)::ObjectStruct> *)&state);
    std::_Function_base::~_Function_base((_Function_base *)&s2);
    Json::Value::Value((Value *)&helper,objectValue);
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_start._0_1_ = 0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_start._1_7_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    state.doc._M_string_length = 0;
    state.doc.field_2._M_local_buf[0] = '\0';
    state.doc._M_dataplus._M_p = (pointer)paVar1;
    Json::Value::Value((Value *)&i,"Hello");
    pVVar9 = Json::Value::operator[]((Value *)&helper,"field1");
    Json::Value::operator=(pVVar9,(Value *)&i);
    Json::Value::~Value((Value *)&i);
    Json::Value::Value((Value *)&i,2);
    pVVar9 = Json::Value::operator[]((Value *)&helper,"field2");
    Json::Value::operator=(pVVar9,(Value *)&i);
    Json::Value::~Value((Value *)&i);
    Json::Value::Value((Value *)&i,"world!");
    pVVar9 = Json::Value::operator[]((Value *)&helper,"field3");
    Json::Value::operator=(pVVar9,(Value *)&i);
    Json::Value::~Value((Value *)&i);
    Json::Value::Value((Value *)&i,"extra");
    pVVar9 = Json::Value::operator[]((Value *)&helper,"extra");
    Json::Value::operator=(pVVar9,(Value *)&i);
    Json::Value::~Value((Value *)&i);
    pcStack_450 = (char *)0x0;
    local_448._0_8_ = local_448._0_8_ & 0xffffffffffffff00;
    _i = local_448;
    bVar5 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                      ((Object<(anonymous_namespace)::ObjectStruct> *)&v,(ObjectStruct *)&i,
                       (Value *)&helper,&state);
    if (bVar5) {
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &i,"Hello");
      if (!bVar5) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(s1.Field1 == \"Hello\") failed on line ");
        iVar11 = 0x130;
        goto LAB_0019cb78;
      }
      if (local_438._0_4_ != 2) {
        poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(s1.Field2 == 2) failed on line "
                                );
        iVar11 = 0x131;
        goto LAB_0019cb78;
      }
      Json::Value::Value(&v_4,objectValue);
      Json::Value::operator=((Value *)&helper,&v_4);
      Json::Value::~Value(&v_4);
      v_4.value_.string_ = (char *)&v_4.comments_;
      v_4.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
      v_4._12_4_ = 0;
      v_4.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl =
           (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            )((ulong)v_4.comments_.ptr_._M_t.
                     super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                     .
                     super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                     ._M_head_impl & 0xffffffffffffff00);
      bVar5 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                        ((Object<(anonymous_namespace)::ObjectStruct> *)&v,(ObjectStruct *)&v_4,
                         (Value *)&helper,&state);
      if (bVar5) {
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&v_4,"default");
        if (!bVar5) {
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(s2.Field1 == \"default\") failed on line ");
          iVar11 = 0x136;
          goto LAB_0019d4db;
        }
        if ((int)v_4.limit_ != 1) {
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(s2.Field2 == 1) failed on line ");
          iVar11 = 0x137;
          goto LAB_0019d4db;
        }
        s1.Field1._M_dataplus._M_p = (pointer)&s1.Field1.field_2;
        s1.Field1._M_string_length = 0;
        s1.Field1.field_2._M_allocated_capacity =
             s1.Field1.field_2._M_allocated_capacity & 0xffffffffffffff00;
        bVar5 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                          ((Object<(anonymous_namespace)::ObjectStruct> *)&v,&s1,(Value *)0x0,&state
                          );
        if (bVar5) {
          bVar5 = std::operator==(&s1.Field1,"default");
          if (!bVar5) {
            poVar7 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(s3.Field1 == \"default\") failed on line ");
            iVar11 = 0x13b;
            goto LAB_0019d8db;
          }
          bVar5 = true;
          if (s1.Field2 != 1) {
            poVar7 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(s3.Field2 == 1) failed on line ");
            iVar11 = 0x13c;
            goto LAB_0019d8db;
          }
        }
        else {
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(helper(s3, nullptr, &state)) failed on line ");
          iVar11 = 0x13a;
LAB_0019d8db:
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar11);
          std::operator<<(poVar7,"\n");
          bVar5 = false;
        }
        std::__cxx11::string::~string((string *)&s1);
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(helper(s2, &v, &state)) failed on line ");
        iVar11 = 0x135;
LAB_0019d4db:
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar11);
        std::operator<<(poVar7,"\n");
        bVar5 = false;
      }
      std::__cxx11::string::~string((string *)&v_4);
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(helper(s1, &v, &state)) failed on line ");
      iVar11 = 0x12f;
LAB_0019cb78:
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar11);
      std::operator<<(poVar7,"\n");
      bVar5 = false;
    }
    std::__cxx11::string::~string((string *)&i);
    cmJSONState::~cmJSONState(&state);
    Json::Value::~Value((Value *)&helper);
    cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::~Object
              ((Object<(anonymous_namespace)::ObjectStruct> *)&v);
    if (!bVar5) {
      return 1;
    }
    Json::Value::Value((Value *)&helper,arrayValue);
    v.limit_ = 0;
    v.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl =
         (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
            )0x0;
    v.start_ = 0;
    v.value_.int_ = 0;
    v.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
    v._12_4_ = 0;
    Json::Value::Value((Value *)&state,"Hello");
    Json::Value::append((Value *)&helper,(Value *)&state);
    Json::Value::~Value((Value *)&state);
    Json::Value::Value((Value *)&state,"world!");
    Json::Value::append((Value *)&helper,(Value *)&state);
    Json::Value::~Value((Value *)&state);
    Json::Value::Value((Value *)&state,"ignore");
    Json::Value::append((Value *)&helper,(Value *)&state);
    Json::Value::~Value((Value *)&state);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&state,"default",(allocator<char> *)&v_4);
    __l._M_len = 1;
    __l._M_array = (iterator)&state;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i,__l,(allocator_type *)&s1);
    std::__cxx11::string::~string((string *)&state);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&state,"Hello",(allocator<char> *)&s1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &state.errors.
                super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
                super__Vector_impl_data._M_finish,"world!",(allocator<char> *)&s2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)paVar1->_M_local_buf,"ignore",(allocator<char> *)&s3);
    __l_00._M_len = 3;
    __l_00._M_array = (iterator)&state;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v_4,__l_00,(allocator_type *)&s4);
    lVar14 = 0x40;
    do {
      std::__cxx11::string::~string
                ((string *)
                 ((long)&state.parseStack.
                         super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar14));
      lVar14 = lVar14 + -0x20;
    } while (lVar14 != -0x20);
    bVar5 = std::
            function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
            ::operator()((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                          *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&i,(Value *)&helper,(cmJSONState *)&v);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(StringVectorHelper(l, &v, &state)) failed on line ");
      iVar11 = 0x14b;
LAB_0019ce9b:
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar11);
      std::operator<<(poVar7,"\n");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&v_4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&i);
      cmJSONState::~cmJSONState((cmJSONState *)&v);
      this = &helper;
      goto LAB_0019acc2;
    }
    bVar5 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&i,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&v_4);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(l == expected) failed on line ");
      iVar11 = 0x14c;
      goto LAB_0019ce9b;
    }
    Json::Value::Value((Value *)&state,2);
    pVVar9 = Json::Value::operator[]((Value *)&helper,1);
    Json::Value::operator=(pVVar9,(Value *)&state);
    Json::Value::~Value((Value *)&state);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&state,"default",(allocator<char> *)&s1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&i,&state,
               &state.errors.
                super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
                super__Vector_impl_data._M_finish);
    std::__cxx11::string::~string((string *)&state);
    bVar5 = std::
            function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
            ::operator()((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                          *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&i,(Value *)&helper,(cmJSONState *)&v);
    if (bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(!StringVectorHelper(l, &v, &state)) failed on line ");
      iVar11 = 0x150;
      goto LAB_0019ce9b;
    }
    Json::Value::Value((Value *)&state,"Hello");
    Json::Value::operator=((Value *)&helper,(Value *)&state);
    Json::Value::~Value((Value *)&state);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&state,"default",(allocator<char> *)&s1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&i,&state,
               &state.errors.
                super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
                super__Vector_impl_data._M_finish);
    std::__cxx11::string::~string((string *)&state);
    bVar5 = std::
            function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
            ::operator()((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                          *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&i,(Value *)&helper,(cmJSONState *)&v);
    if (bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(!StringVectorHelper(l, &v, &state)) failed on line ");
      iVar11 = 0x154;
      goto LAB_0019ce9b;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&state,"default",(allocator<char> *)&s1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&i,&state,
               &state.errors.
                super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
                super__Vector_impl_data._M_finish);
    std::__cxx11::string::~string((string *)&state);
    bVar5 = std::
            function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
            ::operator()((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                          *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&i,(Value *)0x0,(cmJSONState *)&v);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(StringVectorHelper(l, nullptr, &state)) failed on line "
                              );
      iVar11 = 0x157;
      goto LAB_0019ce9b;
    }
    if ((char *)_i != pcStack_450) {
      poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(l.empty()) failed on line ");
      iVar11 = 0x158;
      goto LAB_0019ce9b;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&v_4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
    cmJSONState::~cmJSONState((cmJSONState *)&v);
    Json::Value::~Value((Value *)&helper);
    Json::Value::Value((Value *)&helper,arrayValue);
    paVar1 = &state.doc.field_2;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_start._0_1_ = 0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_start._1_7_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    state.doc._M_string_length = 0;
    state.doc.field_2._M_local_buf[0] = '\0';
    state.doc._M_dataplus._M_p = (pointer)paVar1;
    Json::Value::Value(&v,"Hello");
    Json::Value::append((Value *)&helper,&v);
    Json::Value::~Value(&v);
    Json::Value::Value(&v,"world!");
    Json::Value::append((Value *)&helper,&v);
    Json::Value::~Value(&v);
    Json::Value::Value(&v,"ignore");
    Json::Value::append((Value *)&helper,&v);
    Json::Value::~Value(&v);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&v,"default",(allocator<char> *)&v_4);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&v;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i,__l_01,(allocator_type *)&s1);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::string<std::allocator<char>>((string *)&v,"Hello",(allocator<char> *)&s1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&v.limit_,"world!",(allocator<char> *)&s2);
    __l_02._M_len = 2;
    __l_02._M_array = (iterator)&v;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v_4,__l_02,(allocator_type *)&s3);
    lVar14 = 0x20;
    do {
      std::__cxx11::string::~string((string *)((long)&v.value_ + lVar14));
      lVar14 = lVar14 + -0x20;
    } while (lVar14 != -0x20);
    bVar5 = std::
            function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
            ::operator()((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                          *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&i,(Value *)&helper,&state);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(StringVectorFilterHelper(l, &v, &state)) failed on line "
                              );
      iVar12 = 0x16a;
LAB_0019d938:
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar12);
      std::operator<<(poVar7,"\n");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&v_4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&i);
      cmJSONState::~cmJSONState(&state);
      Json::Value::~Value((Value *)&helper);
      return 1;
    }
    bVar5 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&i,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&v_4);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(l == expected) failed on line ");
      iVar12 = 0x16b;
      goto LAB_0019d938;
    }
    Json::Value::Value(&v,2);
    iVar12 = 1;
    pVVar9 = Json::Value::operator[]((Value *)&helper,1);
    Json::Value::operator=(pVVar9,&v);
    Json::Value::~Value(&v);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&v,"default",(allocator<char> *)&s1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&i,&v,&v.limit_)
    ;
    std::__cxx11::string::~string((string *)&v);
    bVar5 = std::
            function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
            ::operator()((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                          *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&i,(Value *)&helper,&state);
    if (bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(!StringVectorFilterHelper(l, &v, &state)) failed on line "
                              );
      iVar12 = 0x16f;
      goto LAB_0019d938;
    }
    Json::Value::Value(&v,"Hello");
    Json::Value::operator=((Value *)&helper,&v);
    Json::Value::~Value(&v);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&v,"default",(allocator<char> *)&s1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&i,&v,&v.limit_)
    ;
    std::__cxx11::string::~string((string *)&v);
    bVar5 = std::
            function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
            ::operator()((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                          *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&i,(Value *)&helper,&state);
    if (bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(!StringVectorFilterHelper(l, &v, &state)) failed on line "
                              );
      iVar12 = 0x173;
      goto LAB_0019d938;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&v,"default",(allocator<char> *)&s1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&i,&v,&v.limit_)
    ;
    std::__cxx11::string::~string((string *)&v);
    bVar5 = std::
            function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
            ::operator()((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                          *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&i,(Value *)0x0,&state);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(StringVectorFilterHelper(l, nullptr, &state)) failed on line "
                              );
      iVar12 = 0x176;
      goto LAB_0019d938;
    }
    if ((char *)_i != pcStack_450) {
      poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(l.empty()) failed on line ");
      iVar12 = 0x177;
      goto LAB_0019d938;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&v_4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
    cmJSONState::~cmJSONState(&state);
    Json::Value::~Value((Value *)&helper);
    Json::Value::Value(&v_4,objectValue);
    Json::Value::Value((Value *)&state,"Hello");
    pVVar9 = Json::Value::operator[](&v_4,"field1");
    Json::Value::operator=(pVVar9,(Value *)&state);
    Json::Value::~Value((Value *)&state);
    Json::Value::Value((Value *)&state,"world!");
    pVVar9 = Json::Value::operator[](&v_4,"field2");
    Json::Value::operator=(pVVar9,(Value *)&state);
    Json::Value::~Value((Value *)&state);
    Json::Value::Value((Value *)&state,"ignore");
    pVVar9 = Json::Value::operator[](&v_4,"ignore");
    Json::Value::operator=(pVVar9,(Value *)&state);
    Json::Value::~Value((Value *)&state);
    v.limit_ = 0;
    v.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl =
         (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
            )0x0;
    v.start_ = 0;
    v.value_.int_ = 0;
    v.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
    v._12_4_ = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[4],_const_char_(&)[8],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&state,(char (*) [4])0x7f5e5a,(char (*) [8])0x7ef74f);
    __l_03._M_len = 1;
    __l_03._M_array = (iterator)&state;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&helper,__l_03,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &i,(allocator_type *)&s1);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&state);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[7],_const_char_(&)[6],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&state,(char (*) [7])"field1",(char (*) [6])"Hello");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[7],_const_char_(&)[7],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)paVar1,(char (*) [7])"field2",(char (*) [7])0x76ec97);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[7],_const_char_(&)[7],_true>
              (&local_2e8,(char (*) [7])"ignore",(char (*) [7])"ignore");
    __l_04._M_len = 3;
    __l_04._M_array = (iterator)&state;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&i,__l_04,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &s1,(allocator_type *)&s2);
    lVar14 = 0x80;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&state.parseStack.
                         super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar14));
      lVar14 = lVar14 + -0x40;
    } while (lVar14 != -0x40);
    bVar5 = std::
            function<bool_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
            ::operator()((function<bool_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                          *)(anonymous_namespace)::StringMapHelper_abi_cxx11_,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&helper,&v_4,(cmJSONState *)&v);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(StringMapHelper(m, &v, &state)) failed on line ");
      iVar11 = 0x188;
LAB_0019decf:
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar11);
      std::operator<<(poVar7,"\n");
LAB_0019dee3:
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&i);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&helper);
      cmJSONState::~cmJSONState((cmJSONState *)&v);
      this = (Object<(anonymous_namespace)::ObjectStruct> *)&v_4;
      goto LAB_0019acc2;
    }
    bVar5 = std::operator==((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&helper,
                            (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&i);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(m == expected) failed on line ");
      iVar11 = 0x189;
      goto LAB_0019decf;
    }
    Json::Value::Value((Value *)&state,arrayValue);
    Json::Value::operator=(&v_4,(Value *)&state);
    Json::Value::~Value((Value *)&state);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[4],_const_char_(&)[8],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&state,(char (*) [4])0x7f5e5a,(char (*) [8])0x7ef74f);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_assign_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&helper,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&state,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&state.doc.field_2);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&state);
    bVar5 = std::
            function<bool_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
            ::operator()((function<bool_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                          *)(anonymous_namespace)::StringMapHelper_abi_cxx11_,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&helper,&v_4,(cmJSONState *)&v);
    if (bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(!StringMapHelper(m, &v, &state)) failed on line ");
      iVar11 = 0x18d;
      goto LAB_0019decf;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[4],_const_char_(&)[8],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&state,(char (*) [4])0x7f5e5a,(char (*) [8])0x7ef74f);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_assign_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&helper,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&state,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&state.doc.field_2);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&state);
    bVar5 = std::
            function<bool_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
            ::operator()((function<bool_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                          *)(anonymous_namespace)::StringMapHelper_abi_cxx11_,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&helper,(Value *)0x0,(cmJSONState *)&v);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(StringMapHelper(m, nullptr, &state)) failed on line ");
      iVar11 = 400;
      goto LAB_0019decf;
    }
    if (helper.Error.super__Function_base._M_functor._8_8_ != 0) {
      poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(m.empty()) failed on line ");
      iVar11 = 0x191;
      goto LAB_0019decf;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&i);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&helper);
    cmJSONState::~cmJSONState((cmJSONState *)&v);
    Json::Value::~Value(&v_4);
    Json::Value::Value(&v_4,objectValue);
    v.limit_ = 0;
    v.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl =
         (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
            )0x0;
    v.start_ = 0;
    v.value_.int_ = 0;
    v.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
    v._12_4_ = 0;
    Json::Value::Value((Value *)&state,"Hello");
    pVVar9 = Json::Value::operator[](&v_4,"field1");
    Json::Value::operator=(pVVar9,(Value *)&state);
    Json::Value::~Value((Value *)&state);
    Json::Value::Value((Value *)&state,"world!");
    pVVar9 = Json::Value::operator[](&v_4,"field2");
    Json::Value::operator=(pVVar9,(Value *)&state);
    Json::Value::~Value((Value *)&state);
    Json::Value::Value((Value *)&state,"ignore");
    pVVar9 = Json::Value::operator[](&v_4,"ignore");
    Json::Value::operator=(pVVar9,(Value *)&state);
    Json::Value::~Value((Value *)&state);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[4],_const_char_(&)[8],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&state,(char (*) [4])0x7f5e5a,(char (*) [8])0x7ef74f);
    __l_05._M_len = 1;
    __l_05._M_array = (iterator)&state;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&helper,__l_05,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &i,(allocator_type *)&s1);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&state);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[7],_const_char_(&)[6],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&state,(char (*) [7])"field1",(char (*) [6])"Hello");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[7],_const_char_(&)[7],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&state.doc.field_2,(char (*) [7])"field2",(char (*) [7])0x76ec97);
    __l_06._M_len = 2;
    __l_06._M_array = (iterator)&state;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&i,__l_06,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &s1,(allocator_type *)&s2);
    lVar14 = 0x40;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&state.parseStack.
                         super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar14));
      lVar14 = lVar14 + -0x40;
    } while (lVar14 != -0x40);
    bVar5 = std::
            function<bool_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
            ::operator()((function<bool_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                          *)(anonymous_namespace)::StringMapFilterHelper_abi_cxx11_,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&helper,&v_4,(cmJSONState *)&v);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(StringMapFilterHelper(m, &v, &state)) failed on line ");
      iVar11 = 0x1a1;
LAB_0019e229:
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar11);
      std::operator<<(poVar7,"\n");
      goto LAB_0019dee3;
    }
    bVar5 = std::operator==((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&helper,
                            (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&i);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(m == expected) failed on line ");
      iVar11 = 0x1a2;
      goto LAB_0019e229;
    }
    Json::Value::Value((Value *)&state,arrayValue);
    Json::Value::operator=(&v_4,(Value *)&state);
    Json::Value::~Value((Value *)&state);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[4],_const_char_(&)[8],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&state,(char (*) [4])0x7f5e5a,(char (*) [8])0x7ef74f);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_assign_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&helper,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&state,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&state.doc.field_2);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&state);
    bVar5 = std::
            function<bool_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
            ::operator()((function<bool_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                          *)(anonymous_namespace)::StringMapFilterHelper_abi_cxx11_,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&helper,&v_4,(cmJSONState *)&v);
    if (bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(!StringMapFilterHelper(m, &v, &state)) failed on line ")
      ;
      iVar11 = 0x1a6;
      goto LAB_0019e229;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[4],_const_char_(&)[8],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&state,(char (*) [4])0x7f5e5a,(char (*) [8])0x7ef74f);
    paVar1 = &state.doc.field_2;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_assign_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&helper,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&state,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)paVar1);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&state);
    bVar5 = std::
            function<bool_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
            ::operator()((function<bool_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                          *)(anonymous_namespace)::StringMapFilterHelper_abi_cxx11_,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&helper,(Value *)0x0,(cmJSONState *)&v);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(StringMapFilterHelper(m, nullptr, &state)) failed on line "
                              );
      iVar11 = 0x1a9;
      goto LAB_0019e229;
    }
    if (helper.Error.super__Function_base._M_functor._8_8_ != 0) {
      poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(m.empty()) failed on line ");
      iVar11 = 0x1aa;
      goto LAB_0019e229;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&i);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&helper);
    cmJSONState::~cmJSONState((cmJSONState *)&v);
    Json::Value::~Value(&v_4);
    Json::Value::Value(&v,"Hello");
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_start._0_1_ = 0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_start._1_7_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    state.doc._M_string_length = 0;
    state.doc.field_2._M_local_buf[0] = '\0';
    state.doc._M_dataplus._M_p = (pointer)paVar1;
    std::_Optional_payload_base<std::__cxx11::string>::_Optional_payload_base<char_const(&)[8]>
              ((_Optional_payload_base<std::__cxx11::string> *)&helper,"default");
    bVar5 = std::
            function<bool_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
            ::operator()((function<bool_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                          *)(anonymous_namespace)::OptionalStringHelper_abi_cxx11_,
                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&helper,&v,&state);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(OptionalStringHelper(str, &v, &state)) failed on line ")
      ;
      iVar12 = 0x1b5;
LAB_0019e450:
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar12);
      std::operator<<(poVar7,"\n");
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&helper);
      goto LAB_0019acad;
    }
    _Var6 = std::operator==((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&helper,(char (*) [6])"Hello");
    if (!_Var6) {
      poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(str == \"Hello\") failed on line "
                              );
      iVar12 = 0x1b6;
      goto LAB_0019e450;
    }
    std::optional<std::__cxx11::string>::emplace<char_const(&)[8]>
              ((optional<std::__cxx11::string> *)&helper,(char (*) [8])0x7ef74f);
    bVar5 = std::
            function<bool_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
            ::operator()((function<bool_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                          *)(anonymous_namespace)::OptionalStringHelper_abi_cxx11_,
                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&helper,(Value *)0x0,&state);
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(OptionalStringHelper(str, nullptr, &state)) failed on line "
                              );
      iVar12 = 0x1b9;
      goto LAB_0019e450;
    }
    if (helper.Error.super__Function_base._M_functor._M_pod_data[0] == '\x01') {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(str == cm::nullopt) failed on line ");
      iVar12 = 0x1ba;
      goto LAB_0019e450;
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&helper);
    cmJSONState::~cmJSONState(&state);
    Json::Value::~Value(&v);
    Json::Value::Value(&v,"Hello");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i,"default",(allocator<char> *)&state);
    v_4.value_.int_._0_4_ = 1;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_start._0_1_ = 0;
    state.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl
    .super__Vector_impl_data._M_start._1_7_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    state.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    state.doc._M_string_length = 0;
    state.doc.field_2._M_local_buf[0] = '\0';
    state.doc._M_dataplus._M_p = (pointer)paVar1;
    bVar5 = std::
            function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
            ::operator()((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                          *)(anonymous_namespace)::RequiredStringHelper_abi_cxx11_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,&v,
                         &state);
    if (bVar5) {
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &i,"Hello");
      if (!bVar5) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(str == \"Hello\") failed on line ");
        iVar12 = 0x1c6;
        goto LAB_0019e725;
      }
      bVar5 = std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::operator()
                        ((function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)
                         (anonymous_namespace)::RequiredIntHelper,(int *)&v_4,&v,&state);
      if (bVar5) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(!RequiredIntHelper(i, &v, &state)) failed on line ");
        iVar12 = 0x1c7;
        goto LAB_0019e725;
      }
      Json::Value::Value((Value *)&helper,2);
      Json::Value::operator=(&v,(Value *)&helper);
      Json::Value::~Value((Value *)&helper);
      std::__cxx11::string::assign((char *)&i);
      v_4.value_.int_._0_4_ = 1;
      bVar5 = std::
              function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              ::operator()((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                            *)(anonymous_namespace)::RequiredStringHelper_abi_cxx11_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                           &v,&state);
      if (bVar5) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(!RequiredStringHelper(str, &v, &state)) failed on line "
                                );
        iVar12 = 0x1cc;
        goto LAB_0019e725;
      }
      bVar5 = std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::operator()
                        ((function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)
                         (anonymous_namespace)::RequiredIntHelper,(int *)&v_4,&v,&state);
      if (!bVar5) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(RequiredIntHelper(i, &v, &state)) failed on line ");
        iVar12 = 0x1cd;
        goto LAB_0019e725;
      }
      if (v_4.value_.int_._0_4_ != 2) {
        poVar7 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(i == 2) failed on line ");
        iVar12 = 0x1ce;
        goto LAB_0019e725;
      }
      std::__cxx11::string::assign((char *)&i);
      v_4.value_.int_._0_4_ = 1;
      bVar5 = std::
              function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              ::operator()((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                            *)(anonymous_namespace)::RequiredStringHelper_abi_cxx11_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                           (Value *)0x0,&state);
      if (bVar5) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(!RequiredStringHelper(str, nullptr, &state)) failed on line "
                                );
        iVar12 = 0x1d2;
        goto LAB_0019e725;
      }
      iVar12 = 0;
      bVar5 = std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::operator()
                        ((function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)
                         (anonymous_namespace)::RequiredIntHelper,(int *)&v_4,(Value *)0x0,&state);
      if (bVar5) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(!RequiredIntHelper(i, nullptr, &state)) failed on line "
                                );
        iVar12 = 0x1d3;
        goto LAB_0019e725;
      }
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(RequiredStringHelper(str, &v, &state)) failed on line ")
      ;
      iVar12 = 0x1c5;
LAB_0019e725:
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar12);
      std::operator<<(poVar7,"\n");
      iVar12 = 1;
    }
    cmJSONState::~cmJSONState(&state);
    std::__cxx11::string::~string((string *)&i);
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(IntHelper(i, &v, &state)) failed on line ");
    iVar12 = 0x55;
LAB_0019ac95:
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar12);
    std::operator<<(poVar7,"\n");
LAB_0019acad:
    iVar12 = 1;
    cmJSONState::~cmJSONState(&state);
  }
  this = (Object<(anonymous_namespace)::ObjectStruct> *)&v;
LAB_0019acc2:
  Json::Value::~Value((Value *)this);
  return iVar12;
}

Assistant:

int testJSONHelpers(int /*unused*/, char* /*unused*/[])
{
  if (!testInt()) {
    return 1;
  }
  if (!testUInt()) {
    return 1;
  }
  if (!testBool()) {
    return 1;
  }
  if (!testString()) {
    return 1;
  }
  if (!testObject()) {
    return 1;
  }
  if (!testObjectInherited()) {
    return 1;
  }
  if (!testObjectNoExtra()) {
    return 1;
  }
  if (!testObjectOptional()) {
    return 1;
  }
  if (!testVector()) {
    return 1;
  }
  if (!testVectorFilter()) {
    return 1;
  }
  if (!testMap()) {
    return 1;
  }
  if (!testMapFilter()) {
    return 1;
  }
  if (!testOptional()) {
    return 1;
  }
  if (!testRequired()) {
    return 1;
  }
  return 0;
}